

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_state.c
# Opt level: O3

void setup_simple_state_c(kcc_kinematic_chain *kc,solver_state_c *s)

{
  int iVar1;
  gc_pose *pgVar2;
  gc_pose *pgVar3;
  gc_twist *pgVar4;
  gc_twist *pgVar5;
  gc_twist *pgVar6;
  gc_acc_twist *pgVar7;
  gc_acc_twist *pgVar8;
  gc_acc_twist *pgVar9;
  gc_acc_twist *pgVar10;
  gc_acc_twist *pgVar11;
  mc_abi *pmVar12;
  mc_momentum *pmVar13;
  mc_wrench *pmVar14;
  mc_wrench *pmVar15;
  mc_wrench *pmVar16;
  mc_wrench *pmVar17;
  joint_torque *pjVar18;
  mc_wrench *pmVar19;
  mc_wrench *pmVar20;
  mc_wrench *pmVar21;
  mc_wrench *pmVar22;
  mc_wrench *pmVar23;
  joint_position *pjVar24;
  joint_velocity *pjVar25;
  joint_acceleration *pjVar26;
  void *pvVar27;
  size_t __nmemb;
  size_t __nmemb_00;
  long lVar28;
  
  iVar1 = kc->number_of_segments;
  __nmemb_00 = (size_t)iVar1;
  s->nbody = iVar1;
  s->nq = iVar1;
  s->nd = iVar1;
  pgVar3 = (gc_pose *)calloc(__nmemb_00,0x10);
  s->x_jnt = pgVar3;
  pgVar3 = (gc_pose *)calloc(__nmemb_00,0x10);
  s->x_rel = pgVar3;
  __nmemb = (size_t)(int)(iVar1 + 1U);
  pgVar3 = (gc_pose *)calloc(__nmemb,0x10);
  s->x_tot = pgVar3;
  pgVar4 = (gc_twist *)calloc(__nmemb_00,0x10);
  s->xd_jnt = pgVar4;
  pgVar5 = (gc_twist *)calloc(__nmemb_00,0x10);
  s->xd_tf = pgVar5;
  pgVar6 = (gc_twist *)calloc(__nmemb,0x10);
  s->xd = pgVar6;
  pgVar7 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_jnt = pgVar7;
  pgVar8 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_net = pgVar8;
  pgVar9 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_bias = pgVar9;
  pgVar10 = (gc_acc_twist *)calloc(__nmemb,0x10);
  s->xdd_tf = pgVar10;
  pgVar10 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_nact = pgVar10;
  pgVar11 = (gc_acc_twist *)calloc(__nmemb,0x10);
  s->xdd = pgVar11;
  pmVar12 = (mc_abi *)calloc(__nmemb,0xd8);
  s->m_art = pmVar12;
  pmVar12 = (mc_abi *)calloc(__nmemb_00,0xd8);
  s->m_app = pmVar12;
  pmVar12 = (mc_abi *)calloc(__nmemb,0xd8);
  s->m_tf = pmVar12;
  pmVar13 = (mc_momentum *)calloc(__nmemb_00,0x10);
  s->p = pmVar13;
  pmVar14 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_bias_art = pmVar14;
  pmVar14 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_eom = pmVar14;
  pmVar15 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_app = pmVar15;
  pmVar16 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_tf = pmVar16;
  pmVar17 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_nact = pmVar17;
  pjVar18 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_bias_art = pjVar18;
  pmVar19 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_ff_art = pmVar19;
  pmVar19 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ff_app = pmVar19;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ff_jnt = pmVar20;
  pjVar18 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ff_art = pjVar18;
  pjVar18 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ff = pjVar18;
  pmVar21 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext = pmVar21;
  pmVar22 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_ext_art = pmVar22;
  pmVar22 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext_app = pmVar22;
  pmVar23 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext_tf = pmVar23;
  pjVar18 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ext_art = pjVar18;
  pjVar24 = (joint_position *)calloc(__nmemb_00,8);
  s->q = pjVar24;
  pjVar25 = (joint_velocity *)calloc(__nmemb_00,8);
  s->qd = pjVar25;
  pjVar26 = (joint_acceleration *)calloc(__nmemb_00,8);
  s->qdd = pjVar26;
  pjVar18 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ctrl = pjVar18;
  if (0 < (long)__nmemb_00) {
    pgVar3 = s->x_jnt;
    pgVar2 = s->x_rel;
    lVar28 = 0;
    do {
      pvVar27 = calloc(1,0x48);
      *(void **)((long)&pgVar3->rotation + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar3->translation + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x48);
      *(void **)((long)&pgVar2->rotation + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar2->translation + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar4->angular_velocity + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar4->linear_velocity + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar5->angular_velocity + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar5->linear_velocity + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar7->angular_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar7->linear_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar9->angular_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar9->linear_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar8->angular_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar8->linear_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar10->angular_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar10->linear_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar13->angular_momentum + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar13->linear_momentum + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar14->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar14->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar15->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar15->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar16->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar16->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar17->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar17->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar19->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar19->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar20->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar20->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar21->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar21->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar22->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar22->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar23->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar23->force + lVar28) = pvVar27;
      lVar28 = lVar28 + 0x10;
    } while (__nmemb_00 << 4 != lVar28);
  }
  pgVar3 = s->x_tot;
  if (-1 < iVar1) {
    pgVar4 = s->xd;
    pgVar7 = s->xdd_tf;
    pgVar8 = s->xdd;
    pmVar14 = s->f_bias_art;
    pmVar15 = s->f_ff_art;
    pmVar16 = s->f_ext_art;
    lVar28 = 0;
    do {
      pvVar27 = calloc(1,0x48);
      *(void **)((long)&pgVar3->rotation + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar3->translation + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar4->angular_velocity + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar4->linear_velocity + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar8->angular_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar8->linear_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar7->angular_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pgVar7->linear_acceleration + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar14->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar14->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar15->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar15->force + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar16->torque + lVar28) = pvVar27;
      pvVar27 = calloc(1,0x18);
      *(void **)((long)&pmVar16->force + lVar28) = pvVar27;
      lVar28 = lVar28 + 0x10;
    } while ((ulong)(iVar1 + 1U) << 4 != lVar28);
  }
  *(undefined8 *)&pgVar3->rotation->field_0 = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x40) = 0x3ff0000000000000;
  return;
}

Assistant:

void setup_simple_state_c(
        const struct kcc_kinematic_chain *kc,
        struct solver_state_c *s)
{
    const int NR_SEGMENTS = kc->number_of_segments;
    const int NR_SEGMENTS_WITH_BASE = NR_SEGMENTS + 1;
    const int EE = NR_SEGMENTS;

    // FPK
    s->nbody = NR_SEGMENTS;
    s->nq = NR_SEGMENTS;
    // FVK
    s->nd = NR_SEGMENTS;

    // FPK
    s->x_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_rel = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_tot = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_pose));
    // FVK
    s->xd_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd_tf  = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd     = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_twist));
    // FAK
    s->xdd_jnt   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_net   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_bias  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_tf    = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    s->xdd_nact  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd       = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    // Inertia
    s->m_art = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    s->m_app = calloc(NR_SEGMENTS, sizeof(struct mc_abi));
    s->m_tf  = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    // Inertial force
    s->p            = calloc(NR_SEGMENTS, sizeof(struct mc_momentum));
    s->f_bias_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_bias_eom   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_nact  = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_bias_art = calloc(s->nd, sizeof(joint_torque));
    // Feed-forward torque
    s->f_ff_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ff_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ff_jnt   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ff_art = calloc(s->nd, sizeof(joint_torque));
    // External force
    s->tau_ff      = calloc(s->nd, sizeof(joint_torque));
    s->f_ext       = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ext_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ext_art = calloc(s->nd, sizeof(joint_torque));

    // FPK
    s->q     = calloc(s->nq, sizeof(double));
    // FVK
    s->qd    = calloc(s->nd, sizeof(double));
    // FAK
    s->qdd   = calloc(s->nd, sizeof(double));
    // Dynamics
    s->tau_ctrl = calloc(s->nd, sizeof(joint_torque));

    for (int i = 0; i < NR_SEGMENTS; i++) {
        // FPK
        s->x_jnt[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_jnt[i].translation = calloc(1, sizeof(struct vector3));
        s->x_rel[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_rel[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd_jnt[i].angular_velocity = calloc(1, sizeof(struct vector3));
        s->xd_jnt[i].linear_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].angular_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].linear_velocity   = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd_jnt[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_jnt[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->p[i].angular_momentum = calloc(1, sizeof(struct vector3));
        s->p[i].linear_momentum  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].torque   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].force    = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext[i].torque     = calloc(1, sizeof(struct vector3));
        s->f_ext[i].force      = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].force   = calloc(1, sizeof(struct vector3));
    }

    for (int i = 0; i < NR_SEGMENTS_WITH_BASE; i++) {
        // FPK
        s->x_tot[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_tot[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd[i].angular_velocity        = calloc(1, sizeof(struct vector3));
        s->xd[i].linear_velocity         = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd[i].angular_acceleration    = calloc(1, sizeof(struct vector3));
        s->xdd[i].linear_acceleration     = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->f_bias_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_art[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_art[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_art[i].force  = calloc(1, sizeof(struct vector3));
    }

    // FPK
    s->x_tot[0].rotation->row_x.x = 1.0;
    s->x_tot[0].rotation->row_y.y = 1.0;
    s->x_tot[0].rotation->row_z.z = 1.0;
}